

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O3

void __thiscall Fifteen::slotUndoMove(Fifteen *this)

{
  int *piVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QArrayData *local_88 [2];
  undefined8 local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  tuple<Move,_unsigned_long,_unsigned_long> local_28;
  
  Controller::undoMove
            (&local_28,
             (this->controller)._M_t.
             super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
             super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
             super__Head_base<0UL,_Controller_*,_false>._M_head_impl);
  if (local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_Move,_false>._M_head_impl == NOT_ALLOWED) {
    QVar2.m_data = (storage_type *)0x0;
    QVar2.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar2);
    local_88[0] = (QArrayData *)CONCAT44(uStack_44,local_48);
    local_78 = local_38;
    QVar3.m_data = (storage_type *)0x13;
    QVar3.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar3);
    local_68 = local_48;
    uStack_64 = uStack_44;
    uStack_60 = uStack_40;
    uStack_5c = uStack_3c;
    local_58 = local_38;
    QMessageBox::information(this,local_88,&local_68,0x400,0);
    piVar1 = (int *)CONCAT44(uStack_64,local_68);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,8);
      }
    }
    if (local_88[0] != (QArrayData *)0x0) {
      LOCK();
      (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88[0],2,8);
      }
    }
  }
  else {
    makeMove(this,local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
                  super__Head_base<0UL,_Move,_false>._M_head_impl,
             local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
             super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,
             (size_t)local_28.super__Tuple_impl<0UL,_Move,_unsigned_long,_unsigned_long>.
                     super__Tuple_impl<1UL,_unsigned_long,_unsigned_long>.
                     super__Tuple_impl<2UL,_unsigned_long>.
                     super__Head_base<2UL,_unsigned_long,_false>._M_head_impl);
  }
  return;
}

Assistant:

void Fifteen::slotUndoMove()
{
    auto [ move, row, col ] = controller->undoMove();
    if ( move == Move::NOT_ALLOWED )
    {
        QMessageBox::information( this, "", "There are no moves\t" );
        return;
    }

    makeMove( move, row, col );
}